

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::SampleMaskCase::genAlphaProgram(SampleMaskCase *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 uVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  ShaderProgram *this_00;
  ProgramSources *pPVar7;
  TestLog *log;
  TestError *this_01;
  ShaderProgram *code;
  allocator<char> local_1c1;
  string local_1c0;
  undefined1 local_199;
  string local_198;
  ShaderSource local_178;
  string local_150;
  ShaderSource local_130;
  ProgramSources local_f8;
  long local_28;
  Functions *gl;
  char *fragShaderSource;
  char *vertexShaderSource;
  SampleMaskCase_conflict *this_local;
  
  fragShaderSource =
       "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nout highp float v_alpha;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_alpha = (a_position.x * 0.5 + 0.5)*(a_position.y * 0.5 + 0.5);\n}\n"
  ;
  gl = (Functions *)anon_var_dwarf_370e68;
  vertexShaderSource = (char *)this;
  pRVar6 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  local_28 = CONCAT44(extraout_var,iVar3);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  local_199 = 1;
  code = this_00;
  pRVar6 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_f8);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_150,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nout highp float v_alpha;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_alpha = (a_position.x * 0.5 + 0.5)*(a_position.y * 0.5 + 0.5);\n}\n"
             ,(char *)code);
  glu::VertexSource::VertexSource((VertexSource *)&local_130,&local_150);
  pPVar7 = glu::ProgramSources::operator<<(&local_f8,&local_130);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_198,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out highp vec4 fragColor;\nin mediump float v_alpha;\nvoid main (void)\n{\n\tfragColor = vec4(1.0, 1.0, 1.0, v_alpha);\n}\n"
             ,(char *)code);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_178,&local_198);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_178);
  glu::ShaderProgram::ShaderProgram(this_00,pRVar6,pPVar7);
  local_199 = 0;
  *(ShaderProgram **)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2 =
       this_00;
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  glu::VertexSource::~VertexSource((VertexSource *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  glu::ProgramSources::~ProgramSources(&local_f8);
  bVar2 = glu::ShaderProgram::isOk
                    ((ShaderProgram *)
                     this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2.
                     _M_allocated_capacity);
  if (!bVar2) {
    log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    glu::operator<<(log,(ShaderProgram *)
                        this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2.
                        _M_allocated_capacity);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"Could not create aplha program.",&local_1c1);
    tcu::TestError::TestError(this_01,&local_1c0);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pcVar1 = *(code **)(local_28 + 0x780);
  dVar4 = glu::ShaderProgram::getProgram
                    ((ShaderProgram *)
                     this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2.
                     _M_allocated_capacity);
  uVar5 = (*pcVar1)(dVar4,"a_position");
  *(undefined4 *)
   ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2 + 8) = uVar5;
  return;
}

Assistant:

void SampleMaskCase::genAlphaProgram (void)
{
	const char* const	vertexShaderSource	=	"${GLSL_VERSION_DECL}\n"
												"in highp vec4 a_position;\n"
												"out highp float v_alpha;\n"
												"void main (void)\n"
												"{\n"
												"	gl_Position = a_position;\n"
												"	v_alpha = (a_position.x * 0.5 + 0.5)*(a_position.y * 0.5 + 0.5);\n"
												"}\n";
	const char* const	fragShaderSource	=	"${GLSL_VERSION_DECL}\n"
												"layout(location = 0) out highp vec4 fragColor;\n"
												"in mediump float v_alpha;\n"
												"void main (void)\n"
												"{\n"
												"	fragColor = vec4(1.0, 1.0, 1.0, v_alpha);\n"
												"}\n";
	const glw::Functions&		gl			=	m_context.getRenderContext().getFunctions();

	m_alphaProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(specializeShader(m_context, vertexShaderSource)) << glu::FragmentSource(specializeShader(m_context, fragShaderSource)));

	if (!m_alphaProgram->isOk())
	{
		m_testCtx.getLog() << *m_alphaProgram;
		throw tcu::TestError("Could not create aplha program.");
	}

	m_alphaProgramPosLoc = gl.getAttribLocation(m_alphaProgram->getProgram(), "a_position");
}